

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3TableAffinity(Vdbe *v,Table *pTab,int iReg)

{
  uint n;
  char *__s;
  size_t sVar1;
  Op *pOVar2;
  
  if ((pTab->tabFlags & 0x10000) != 0) {
    if (iReg != 0) {
      sqlite3VdbeAddOp2(v,0x5f,iReg,(int)pTab->nNVCol);
      sqlite3VdbeAppendP4(v,pTab,-5);
      return;
    }
    sqlite3VdbeAppendP4(v,pTab,-5);
    if (v->db->mallocFailed == '\0') {
      pOVar2 = v->aOp + (long)v->nOp + -1;
    }
    else {
      pOVar2 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar2->opcode = '_';
    sqlite3VdbeAddOp3(v,0x61,pOVar2->p1,pOVar2->p2,pOVar2->p3);
    return;
  }
  __s = pTab->zColAff;
  if (__s == (char *)0x0) {
    __s = sqlite3TableAffinityStr((sqlite3 *)0x0,pTab);
    if (__s == (char *)0x0) {
      sqlite3OomFault(v->db);
      return;
    }
    pTab->zColAff = __s;
  }
  sVar1 = strlen(__s);
  n = (uint)sVar1 & 0x3fffffff;
  if ((sVar1 & 0x3fffffff) != 0) {
    if (iReg == 0) {
      sqlite3VdbeChangeP4(v,-1,__s,n);
      return;
    }
    sqlite3VdbeAddOp4(v,0x60,iReg,n,0,__s,n);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3TableAffinity(Vdbe *v, Table *pTab, int iReg){
  int i;
  char *zColAff;
  if( pTab->tabFlags & TF_Strict ){
    if( iReg==0 ){
      /* Move the previous opcode (which should be OP_MakeRecord) forward
      ** by one slot and insert a new OP_TypeCheck where the current
      ** OP_MakeRecord is found */
      VdbeOp *pPrev;
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
      pPrev = sqlite3VdbeGetLastOp(v);
      assert( pPrev!=0 );
      assert( pPrev->opcode==OP_MakeRecord || sqlite3VdbeDb(v)->mallocFailed );
      pPrev->opcode = OP_TypeCheck;
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pPrev->p1, pPrev->p2, pPrev->p3);
    }else{
      /* Insert an isolated OP_Typecheck */
      sqlite3VdbeAddOp2(v, OP_TypeCheck, iReg, pTab->nNVCol);
      sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
    }
    return;
  }
  zColAff = pTab->zColAff;
  if( zColAff==0 ){
    zColAff = sqlite3TableAffinityStr(0, pTab);
    if( !zColAff ){
      sqlite3OomFault(sqlite3VdbeDb(v));
      return;
    }
    pTab->zColAff = zColAff;
  }
  assert( zColAff!=0 );
  i = sqlite3Strlen30NN(zColAff);
  if( i ){
    if( iReg ){
      sqlite3VdbeAddOp4(v, OP_Affinity, iReg, i, 0, zColAff, i);
    }else{
      assert( sqlite3VdbeGetLastOp(v)->opcode==OP_MakeRecord
              || sqlite3VdbeDb(v)->mallocFailed );
      sqlite3VdbeChangeP4(v, -1, zColAff, i);
    }
  }
}